

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O0

void __thiscall
ft::vector<char,_ft::allocator<char>_>::vector
          (vector<char,_ft::allocator<char>_> *this,vector<char,_ft::allocator<char>_> *other)

{
  size_type n;
  const_iterator first;
  const_iterator last;
  vector<char,_ft::allocator<char>_> *other_local;
  vector<char,_ft::allocator<char>_> *this_local;
  
  this->m_data = (pointer)0x0;
  this->m_size = 0;
  this->m_capacity = 0;
  get_allocator((vector<char,_ft::allocator<char>_> *)&this->field_0x18);
  n = capacity(other);
  reserve(this,n);
  first = begin(other);
  last = end(other);
  vector<char,ft::allocator<char>>::assign<char_const*>
            ((vector<char,ft::allocator<char>> *)this,first,last,(type *)0x0);
  return;
}

Assistant:

vector(vector const & other):
		m_data(NULL),
		m_size(0),
		m_capacity(0),
		m_alloc(other.get_allocator()) {
		this->reserve(other.capacity());
		this->assign(other.begin(), other.end());
	}